

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBExceedBufferLimitTest *this,GLuint test_case_index,
          STAGES stage)

{
  CASES CVar1;
  size_t sVar2;
  int iVar3;
  deUint32 err;
  reference pvVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  GLchar *local_90;
  GLchar *var_use;
  GLchar *var_definition;
  size_t temp;
  size_t position;
  char *pcStack_68;
  GLint max_n_xfb;
  GLchar *index;
  long local_50;
  Functions *gl;
  GLchar buffer [16];
  GLchar *array;
  testCase *test_case;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBExceedBufferLimitTest *this_local;
  string *source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar4 = std::
           vector<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  if (pvVar4->m_stage == stage) {
    buffer._8_8_ = anon_var_dwarf_3d91;
    pRVar5 = deqp::Context::getRenderContext
                       ((this->super_NegativeTestBase).super_TestBase.super_TestCase.m_context);
    iVar3 = (*pRVar5->_vptr_RenderContext[3])();
    local_50 = CONCAT44(extraout_var,iVar3);
    pcStack_68 = "";
    position._4_4_ = 0;
    temp = 0;
    (**(code **)(local_50 + 0x868))(0x8e70,(long)&position + 4);
    err = (**(code **)(local_50 + 0x800))();
    glu::checkError(err,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x5b7c);
    sprintf((char *)&gl,"%d",(ulong)position._4_4_);
    CVar1 = pvVar4->m_case;
    if (CVar1 == BLOCK) {
      var_use = getShaderSource::block_var_definition;
      local_90 = getShaderSource::block_use;
    }
    else if (CVar1 == GLOBAL) {
      var_use = getShaderSource::global_var_definition;
      local_90 = getShaderSource::global_use;
    }
    else {
      if (CVar1 != VECTOR) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x5b8f);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      var_use = getShaderSource::vector_var_definition;
      local_90 = getShaderSource::vector_use;
    }
    switch(stage) {
    case VERTEX:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs_tested);
      break;
    case TESS_CTRL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      pcStack_68 = "[gl_InvocationID]";
      break;
    case TESS_EVAL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tes_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      pcStack_68 = "[0]";
      break;
    case GEOMETRY:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::gs_tested);
      buffer._8_8_ = (long)"QUALIFIER_LISTTYPE VARIABLE_NAME[]" + 0x20;
      pcStack_68 = "[0]";
      break;
    default:
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5ba7);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    sVar2 = temp;
    Utils::replaceToken("VAR_DEFINITION",&temp,var_use,__return_storage_ptr__);
    temp = sVar2;
    Utils::replaceToken("BUFFER",&temp,(GLchar *)&gl,__return_storage_ptr__);
    if (pvVar4->m_case != GLOBAL) {
      Utils::replaceToken("ARRAY",&temp,(GLchar *)buffer._8_8_,__return_storage_ptr__);
    }
    Utils::replaceToken("VARIABLE_USE",&temp,local_90,__return_storage_ptr__);
    Utils::replaceAllTokens("INDEX",pcStack_68,__return_storage_ptr__);
  }
  else {
    switch(pvVar4->m_stage) {
    case VERTEX:
      if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case TESS_CTRL:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case TESS_EVAL:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == TESS_CTRL) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case GEOMETRY:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    default:
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5bef);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFBExceedBufferLimitTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* block_var_definition = "const uint buffer_index = BUFFER;\n"
												"\n"
												"layout (xfb_buffer = buffer_index, xfb_offset = 0) out Goku {\n"
												"    vec4 member;\n"
												"} gokuARRAY;\n";
	static const GLchar* global_var_definition = "const uint buffer_index = BUFFER;\n"
												 "\n"
												 "layout (xfb_buffer = buffer_index) out;\n";
	static const GLchar* vector_var_definition = "const uint buffer_index = BUFFER;\n"
												 "\n"
												 "layout (xfb_buffer = buffer_index) out vec4 gokuARRAY;\n";
	static const GLchar* block_use  = "    gokuINDEX.member = result / 2;\n";
	static const GLchar* global_use = "";
	static const GLchar* vector_use = "    gokuINDEX = result / 2;\n";
	static const GLchar* fs			= "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs = result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar*	array = "";
		GLchar			 buffer[16];
		const Functions& gl		   = m_context.getRenderContext().getFunctions();
		const GLchar*	index	 = "";
		GLint			 max_n_xfb = 0;
		size_t			 position  = 0;
		size_t			 temp;
		const GLchar*	var_definition = 0;
		const GLchar*	var_use		= 0;

		gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_n_xfb);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		sprintf(buffer, "%d", max_n_xfb);

		switch (test_case.m_case)
		{
		case BLOCK:
			var_definition = block_var_definition;
			var_use		   = block_use;
			break;
		case GLOBAL:
			var_definition = global_var_definition;
			var_use		   = global_use;
			break;
		case VECTOR:
			var_definition = vector_var_definition;
			var_use		   = vector_use;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("BUFFER", position, buffer, source);
		if (GLOBAL != test_case.m_case)
		{
			Utils::replaceToken("ARRAY", position, array, source);
		}
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}